

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O3

void av1_save_all_coding_context(AV1_COMP *cpi)

{
  _Bool _Var1;
  AV1_PRIMARY *pAVar2;
  RefCntBuffer *pRVar3;
  RefCntBuffer *pRVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  int8_t iVar10;
  int8_t iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int i;
  MV_STATS *pMVar17;
  MV_STATS *pMVar18;
  byte bVar19;
  bool bVar20;
  byte bVar21;
  
  bVar21 = 0;
  uVar5 = *(undefined8 *)(cpi->common).lf.filter_level;
  iVar14 = (cpi->common).lf.filter_level_u;
  iVar15 = (cpi->common).lf.filter_level_v;
  uVar6 = *(undefined8 *)(cpi->common).lf.backup_filter_level;
  iVar12 = (cpi->common).lf.backup_filter_level_u;
  iVar13 = (cpi->common).lf.backup_filter_level_v;
  uVar8 = (cpi->common).lf.mode_ref_delta_enabled;
  uVar9 = (cpi->common).lf.mode_ref_delta_update;
  iVar10 = (cpi->common).lf.ref_deltas[0];
  iVar11 = (cpi->common).lf.ref_deltas[1];
  uVar7 = *(undefined8 *)((cpi->common).lf.ref_deltas + 2);
  (cpi->coding_context).lf.sharpness_level = (cpi->common).lf.sharpness_level;
  (cpi->coding_context).lf.mode_ref_delta_enabled = uVar8;
  (cpi->coding_context).lf.mode_ref_delta_update = uVar9;
  (cpi->coding_context).lf.ref_deltas[0] = iVar10;
  (cpi->coding_context).lf.ref_deltas[1] = iVar11;
  *(undefined8 *)((cpi->coding_context).lf.ref_deltas + 2) = uVar7;
  *(undefined8 *)(cpi->coding_context).lf.backup_filter_level = uVar6;
  (cpi->coding_context).lf.backup_filter_level_u = iVar12;
  (cpi->coding_context).lf.backup_filter_level_v = iVar13;
  *(undefined8 *)(cpi->coding_context).lf.filter_level = uVar5;
  (cpi->coding_context).lf.filter_level_u = iVar14;
  (cpi->coding_context).lf.filter_level_v = iVar15;
  memcpy(&(cpi->coding_context).cdef_info,&(cpi->common).cdef_info,0x108);
  memcpy(&(cpi->coding_context).rc,&cpi->rc,0x140);
  pAVar2 = cpi->ppi;
  pMVar17 = &pAVar2->mv_stats;
  pMVar18 = &(cpi->coding_context).mv_stats;
  for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
    iVar12 = pMVar17->q;
    pMVar18->high_prec = pMVar17->high_prec;
    pMVar18->q = iVar12;
    pMVar17 = (MV_STATS *)((long)pMVar17 + ((ulong)bVar21 * -2 + 1) * 8);
    pMVar18 = (MV_STATS *)((long)pMVar18 + (ulong)bVar21 * -0x10 + 8);
  }
  (cpi->coding_context).mv_stats.valid = (pAVar2->mv_stats).valid;
  if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
    _Var1 = (cpi->refresh_frame).golden_frame;
    bVar21 = 1;
    lVar16 = 0;
    do {
      pRVar3 = cpi->scaled_ref_buf[lVar16];
      if (lVar16 == 3) {
        if ((((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (pAVar2->lap_enabled == 0)) &&
             ((cpi->oxcf).mode == '\x01')) &&
            (((cpi->oxcf).gf_cfg.lag_in_frames == 0 && (pAVar2->use_svc == 0)))) &&
           (pRVar3 != (RefCntBuffer *)0x0)) {
          pRVar4 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[3]];
          if ((pRVar3->buf).field_2.field_0.y_crop_width ==
              (pRVar4->buf).field_2.field_0.y_crop_width) {
            bVar20 = (pRVar3->buf).field_3.field_0.y_crop_height ==
                     (pRVar4->buf).field_3.field_0.y_crop_height;
          }
          else {
            bVar20 = false;
          }
          bVar19 = 1;
          if ((_Var1 != false) || (bVar20)) {
LAB_001c81be:
            pRVar3->ref_count = pRVar3->ref_count + -1;
            cpi->scaled_ref_buf[lVar16] = (RefCntBuffer *)0x0;
            bVar21 = bVar19;
          }
          else {
            bVar21 = 0;
          }
        }
        else {
          bVar19 = 1;
          if (!(bool)(~bVar21 & 1 | pRVar3 == (RefCntBuffer *)0x0)) goto LAB_001c81be;
          bVar21 = pRVar3 == (RefCntBuffer *)0x0 & bVar21;
        }
      }
      else {
        bVar19 = bVar21;
        if (pRVar3 != (RefCntBuffer *)0x0) goto LAB_001c81be;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != 7);
  }
  return;
}

Assistant:

void av1_save_all_coding_context(AV1_COMP *cpi) {
  save_extra_coding_context(cpi);
  if (!frame_is_intra_only(&cpi->common)) release_scaled_references(cpi);
}